

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_slice.c
# Opt level: O1

MPP_RET dec_ref_pic_marking(H264_SLICE_t *pSlice)

{
  bitread_ctx_t *bitctx;
  h264d_cur_ctx_t *phVar1;
  h264d_video_ctx_t *phVar2;
  h264_drpm_t *phVar3;
  bool bVar4;
  MPP_RET MVar5;
  MPP_RET extraout_EAX;
  h264_drpm_t *phVar6;
  h264_drpm_t **pphVar7;
  h264_drpm_t *phVar8;
  uint uVar9;
  long lVar10;
  RK_S32 _out;
  uint local_54;
  BitReadCtx_t *local_50;
  int local_44;
  RK_S64 local_40;
  h264_drpm_t **local_38;
  
  phVar1 = pSlice->p_Cur;
  phVar2 = pSlice->p_Vid;
  bitctx = &phVar1->bitctx;
  local_44 = (phVar1->bitctx).used_bits;
  local_40 = (phVar1->bitctx).emulation_prevention_bytes_;
  pSlice->drpm_used_bitlen = 0;
  if ((pSlice->idr_flag == 0) &&
     ((pSlice->svc_extension_flag != 0 || ((pSlice->mvcExt).non_idr_flag != 0)))) {
    MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_54);
    (phVar1->bitctx).ret = MVar5;
    if (MVar5 == MPP_OK) {
      pSlice->adaptive_ref_pic_buffering_flag = local_54;
      if (local_54 != 0) {
        local_38 = &pSlice->dec_ref_pic_marking_buffer;
        lVar10 = 0;
        uVar9 = 0;
        local_50 = bitctx;
        do {
          if (pSlice->p_Cur->dec_ref_pic_marking_buffer[lVar10] == (h264_drpm_t *)0x0) {
            phVar6 = (h264_drpm_t *)mpp_osal_calloc("dec_ref_pic_marking",0x20);
            pSlice->p_Cur->dec_ref_pic_marking_buffer[lVar10] = phVar6;
          }
          phVar6 = pSlice->p_Cur->dec_ref_pic_marking_buffer[lVar10];
          phVar6->Next = (h264_drpm_t *)0x0;
          MVar5 = mpp_read_ue(local_50,&local_54);
          (phVar1->bitctx).ret = MVar5;
          if (MVar5 == MPP_OK) {
            uVar9 = local_54;
          }
          bVar4 = true;
          if (MVar5 != MPP_OK) goto LAB_0018f368;
          phVar6->memory_management_control_operation = uVar9;
          if (6 < uVar9) goto switchD_0018f200_caseD_5;
          pphVar7 = (h264_drpm_t **)
                    ((long)&switchD_0018f200::switchdataD_00287594 +
                    (long)(int)(&switchD_0018f200::switchdataD_00287594)[uVar9]);
          switch(uVar9) {
          case 0:
            goto switchD_0018f200_caseD_0;
          default:
            MVar5 = mpp_read_ue(local_50,&local_54);
            (phVar1->bitctx).ret = MVar5;
            bVar4 = true;
            if (MVar5 != MPP_OK) goto LAB_0018f368;
            phVar6->difference_of_pic_nums_minus1 = local_54;
            switch(uVar9) {
            case 2:
              goto switchD_0018f200_caseD_2;
            case 3:
            case 6:
              goto switchD_0018f200_caseD_6;
            case 4:
              goto switchD_0018f200_caseD_4;
            }
            break;
          case 2:
switchD_0018f200_caseD_2:
            MVar5 = mpp_read_ue(local_50,&local_54);
            (phVar1->bitctx).ret = MVar5;
            bVar4 = true;
            if (MVar5 == MPP_OK) {
              phVar6->long_term_pic_num = local_54;
              if (uVar9 != 6) {
                if (uVar9 == 4) goto switchD_0018f200_caseD_4;
                if (uVar9 != 3) break;
              }
              goto switchD_0018f200_caseD_6;
            }
            goto LAB_0018f368;
          case 4:
            goto switchD_0018f200_caseD_4;
          case 5:
            break;
          case 6:
switchD_0018f200_caseD_6:
            MVar5 = mpp_read_ue(local_50,&local_54);
            (phVar1->bitctx).ret = MVar5;
            bVar4 = true;
            if (MVar5 != MPP_OK) goto LAB_0018f368;
            phVar6->long_term_frame_idx = local_54;
            if (uVar9 == 4) {
switchD_0018f200_caseD_4:
              MVar5 = mpp_read_ue(local_50,&local_54);
              (phVar1->bitctx).ret = MVar5;
              bVar4 = true;
              if (MVar5 != MPP_OK) goto LAB_0018f368;
              phVar6->max_long_term_frame_idx_plus1 = local_54;
            }
          }
switchD_0018f200_caseD_5:
          pphVar7 = local_38;
          phVar3 = *local_38;
          if (*local_38 != (h264_drpm_t *)0x0) {
            do {
              phVar8 = phVar3;
              phVar3 = phVar8->Next;
            } while (phVar3 != (h264_drpm_t *)0x0);
            pphVar7 = &phVar8->Next;
          }
          *pphVar7 = phVar6;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x23);
        lVar10 = 0x23;
switchD_0018f200_caseD_0:
        MVar5 = (MPP_RET)pphVar7;
        bVar4 = false;
        if (0x22 < (uint)lVar10) {
          MVar5 = 0x2feca8;
          bVar4 = true;
          if (((byte)h264d_debug & 1) != 0) {
            _mpp_log_l(4,"h264d_slice","Too many memory management control operations.",(char *)0x0)
            ;
            MVar5 = extraout_EAX;
          }
        }
LAB_0018f368:
        if (bVar4) goto LAB_0018f128;
        if (bVar4) {
          return MVar5;
        }
      }
LAB_0018f384:
      pSlice->drpm_used_bitlen =
           ((phVar1->bitctx).used_bits - local_44) +
           ((int)local_40 - (int)(phVar1->bitctx).emulation_prevention_bytes_) * 8;
      return MPP_OK;
    }
  }
  else {
    MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_54);
    (phVar1->bitctx).ret = MVar5;
    if (MVar5 == MPP_OK) {
      pSlice->no_output_of_prior_pics_flag = local_54;
      phVar2->no_output_of_prior_pics_flag = local_54;
      MVar5 = mpp_read_bits(bitctx,1,(RK_S32 *)&local_54);
      (phVar1->bitctx).ret = MVar5;
      if (MVar5 == MPP_OK) {
        pSlice->long_term_reference_flag = local_54;
        goto LAB_0018f384;
      }
    }
  }
LAB_0018f128:
  return (phVar1->bitctx).ret;
}

Assistant:

static MPP_RET dec_ref_pic_marking(H264_SLICE_t *pSlice)
{
    RK_U32 val = 0;
    MPP_RET ret = MPP_ERR_UNKNOW;
    RK_U32 drpm_used_bits = 0;
    RK_U32 emulation_prevention = 0;
    H264_DRPM_t *tmp_drpm = NULL, *tmp_drpm2 = NULL;
    H264dVideoCtx_t *p_Vid = pSlice->p_Vid;
    BitReadCtx_t *p_bitctx = &pSlice->p_Cur->bitctx;

    drpm_used_bits = p_bitctx->used_bits;
    emulation_prevention = p_bitctx->emulation_prevention_bytes_;
    pSlice->drpm_used_bitlen = 0;

    if (pSlice->idr_flag ||
        (pSlice->svc_extension_flag == 0 && pSlice->mvcExt.non_idr_flag == 0)) {
        READ_ONEBIT(p_bitctx, &pSlice->no_output_of_prior_pics_flag);
        p_Vid->no_output_of_prior_pics_flag = pSlice->no_output_of_prior_pics_flag;
        READ_ONEBIT(p_bitctx, &pSlice->long_term_reference_flag);
    } else {
        READ_ONEBIT(p_bitctx, &pSlice->adaptive_ref_pic_buffering_flag);

        if (pSlice->adaptive_ref_pic_buffering_flag) {
            RK_U32 i = 0;

            for (i = 0; i < MAX_MARKING_TIMES; i++) {
                if (!pSlice->p_Cur->dec_ref_pic_marking_buffer[i])
                    pSlice->p_Cur->dec_ref_pic_marking_buffer[i] = mpp_calloc(H264_DRPM_t, 1);
                tmp_drpm = pSlice->p_Cur->dec_ref_pic_marking_buffer[i];
                tmp_drpm->Next = NULL;
                READ_UE(p_bitctx, &val); //!< mmco
                tmp_drpm->memory_management_control_operation = val;
                if (val == 0)
                    break;

                if ((val == 1) || (val == 3)) {
                    READ_UE(p_bitctx, &tmp_drpm->difference_of_pic_nums_minus1);
                }
                if (val == 2) {
                    READ_UE(p_bitctx, &tmp_drpm->long_term_pic_num);
                }
                if ((val == 3) || (val == 6)) {
                    READ_UE(p_bitctx, &tmp_drpm->long_term_frame_idx);
                }
                if (val == 4) {
                    READ_UE(p_bitctx, &tmp_drpm->max_long_term_frame_idx_plus1);
                }
                // add command
                if (pSlice->dec_ref_pic_marking_buffer == NULL) {
                    pSlice->dec_ref_pic_marking_buffer = tmp_drpm;
                } else {
                    tmp_drpm2 = pSlice->dec_ref_pic_marking_buffer;
                    while (tmp_drpm2->Next != NULL) {
                        tmp_drpm2 = tmp_drpm2->Next;
                    }
                    tmp_drpm2->Next = tmp_drpm;
                }
            }
            if (i >= MAX_MARKING_TIMES) {
                H264D_ERR("Too many memory management control operations.");
                goto __BITREAD_ERR;
            }
        }
    }

    // need to minus emulation prevention bytes(0x000003) we met
    emulation_prevention = p_bitctx->emulation_prevention_bytes_ - emulation_prevention;
    pSlice->drpm_used_bitlen = p_bitctx->used_bits - drpm_used_bits - (emulation_prevention * 8);

    return ret = MPP_OK;
__BITREAD_ERR:
    ret = p_bitctx->ret;

    return ret;
}